

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  CordRepBtree *this_00;
  ulong uVar1;
  OpResult OVar2;
  OpResult OVar3;
  
  if ((ulong)(this->super_CordRep).storage[2] - (ulong)(this->super_CordRep).storage[1] < 6) {
    OVar2 = ToOpResult(this,owned);
    this_00 = OVar2.tree;
    uVar1 = (ulong)OVar2.action;
    Add<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>(this_00,edge);
    (this_00->super_CordRep).length = (this_00->super_CordRep).length + delta;
  }
  else {
    this_00 = New(edge);
    uVar1 = 2;
  }
  OVar3._8_8_ = uVar1;
  OVar3.tree = this_00;
  return OVar3;
}

Assistant:

inline OpResult CordRepBtree::AddEdge(bool owned, CordRep* edge, size_t delta) {
  if (size() >= kMaxCapacity) return {New(edge), kPopped};
  OpResult result = ToOpResult(owned);
  result.tree->Add<edge_type>(edge);
  result.tree->length += delta;
  return result;
}